

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O1

size_t mbedtls_mpi_core_clz(mbedtls_mpi_uint a)

{
  ulong uVar1;
  
  uVar1 = 0x3f;
  if (a != 0) {
    for (; a >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  return uVar1 ^ 0x3f;
}

Assistant:

size_t mbedtls_mpi_core_clz(mbedtls_mpi_uint a)
{
#if defined(__has_builtin)
#if (MBEDTLS_MPI_UINT_MAX == UINT_MAX) && __has_builtin(__builtin_clz)
    #define core_clz __builtin_clz
#elif (MBEDTLS_MPI_UINT_MAX == ULONG_MAX) && __has_builtin(__builtin_clzl)
    #define core_clz __builtin_clzl
#elif (MBEDTLS_MPI_UINT_MAX == ULLONG_MAX) && __has_builtin(__builtin_clzll)
    #define core_clz __builtin_clzll
#endif
#endif
#if defined(core_clz)
    return (size_t) core_clz(a);
#else
    size_t j;
    mbedtls_mpi_uint mask = (mbedtls_mpi_uint) 1 << (biL - 1);

    for (j = 0; j < biL; j++) {
        if (a & mask) {
            break;
        }

        mask >>= 1;
    }

    return j;
#endif
}